

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inverse_discrete_cosine_transform.cc
# Opt level: O3

bool __thiscall
sptk::InverseDiscreteCosineTransform::Run
          (InverseDiscreteCosineTransform *this,
          vector<double,_std::allocator<double>_> *real_part_input,
          vector<double,_std::allocator<double>_> *imag_part_input,
          vector<double,_std::allocator<double>_> *real_part_output,
          vector<double,_std::allocator<double>_> *imag_part_output,Buffer *buffer)

{
  vector<double,_std::allocator<double>_> *this_00;
  vector<double,_std::allocator<double>_> *this_01;
  double dVar1;
  double dVar2;
  pointer pdVar3;
  FourierTransformInterface *pFVar4;
  int iVar5;
  double *pdVar6;
  long lVar7;
  pointer pdVar8;
  size_t sVar9;
  double *pdVar10;
  pointer pdVar11;
  pointer pdVar12;
  double *pdVar13;
  size_type sVar14;
  size_type __new_size;
  bool bVar15;
  
  iVar5 = (*((this->fourier_transform_).fourier_transform_)->_vptr_FourierTransformInterface[3])();
  if (((char)iVar5 != '\0') &&
     (lVar7 = (long)(real_part_input->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(real_part_input->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data._M_start, lVar7 >> 3 == (long)this->dct_length_)) {
    if (buffer == (Buffer *)0x0) {
      return false;
    }
    if (imag_part_output == (vector<double,_std::allocator<double>_> *)0x0) {
      return false;
    }
    if (real_part_output == (vector<double,_std::allocator<double>_> *)0x0) {
      return false;
    }
    if ((long)(imag_part_input->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(imag_part_input->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start != lVar7) {
      return false;
    }
    iVar5 = (*((this->fourier_transform_).fourier_transform_)->_vptr_FourierTransformInterface[2])()
    ;
    this_00 = &buffer->fourier_transform_real_part_;
    __new_size = (size_type)iVar5;
    if ((long)(buffer->fourier_transform_real_part_).
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_finish -
        (long)(buffer->fourier_transform_real_part_).
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start >> 3 != __new_size) {
      std::vector<double,_std::allocator<double>_>::resize(this_00,__new_size);
    }
    this_01 = &buffer->fourier_transform_imag_part_;
    if ((long)(buffer->fourier_transform_imag_part_).
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_finish -
        (long)(buffer->fourier_transform_imag_part_).
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start >> 3 != __new_size) {
      std::vector<double,_std::allocator<double>_>::resize(this_01,__new_size);
    }
    pdVar8 = (real_part_input->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pdVar12 = (this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start;
    sVar9 = (long)(real_part_input->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_finish - (long)pdVar8;
    pdVar11 = pdVar8;
    if (sVar9 != 0) {
      memmove(pdVar12,pdVar8,sVar9);
      pdVar8 = (real_part_input->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pdVar12 = (this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start;
      pdVar11 = (real_part_input->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_finish;
    }
    lVar7 = (long)this->dct_length_;
    pdVar10 = pdVar12 + lVar7 + 1;
    pdVar6 = pdVar10;
    while (pdVar8 = pdVar8 + 1, pdVar8 != pdVar11) {
      *pdVar6 = -*pdVar8;
      pdVar6 = pdVar6 + 1;
    }
    pdVar6 = (buffer->fourier_transform_real_part_).
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_finish;
    pdVar13 = pdVar6 + -1;
    if (pdVar10 < pdVar13 && pdVar10 != pdVar6) {
      pdVar6 = pdVar12 + lVar7 + 2;
      do {
        dVar1 = pdVar6[-1];
        pdVar6[-1] = *pdVar13;
        *pdVar13 = dVar1;
        pdVar13 = pdVar13 + -1;
        bVar15 = pdVar6 < pdVar13;
        pdVar6 = pdVar6 + 1;
      } while (bVar15);
    }
    pdVar12[lVar7] = 0.0;
    pdVar8 = (imag_part_input->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    sVar9 = (long)(imag_part_input->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_finish - (long)pdVar8;
    pdVar12 = pdVar8;
    if (sVar9 != 0) {
      memmove((this_01->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start,pdVar8,sVar9);
      pdVar8 = (imag_part_input->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      lVar7 = (long)this->dct_length_;
      pdVar12 = (imag_part_input->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_finish;
    }
    pdVar11 = (this_01->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start;
    pdVar10 = pdVar11 + lVar7 + 1;
    pdVar6 = pdVar10;
    while (pdVar8 = pdVar8 + 1, pdVar8 != pdVar12) {
      *pdVar6 = -*pdVar8;
      pdVar6 = pdVar6 + 1;
    }
    pdVar6 = (buffer->fourier_transform_imag_part_).
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_finish;
    pdVar13 = pdVar6 + -1;
    if (pdVar10 < pdVar13 && pdVar10 != pdVar6) {
      pdVar6 = pdVar11 + lVar7 + 2;
      do {
        dVar1 = pdVar6[-1];
        pdVar6[-1] = *pdVar13;
        *pdVar13 = dVar1;
        pdVar13 = pdVar13 + -1;
        bVar15 = pdVar6 < pdVar13;
        pdVar6 = pdVar6 + 1;
      } while (bVar15);
    }
    pdVar11[lVar7] = 0.0;
    if (0 < iVar5) {
      pdVar8 = (this->cosine_table_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar12 = (this->sine_table_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
      pdVar3 = (this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      sVar14 = 0;
      do {
        dVar1 = pdVar3[sVar14];
        dVar2 = pdVar11[sVar14];
        pdVar3[sVar14] = pdVar8[sVar14] * dVar1 - pdVar12[sVar14] * dVar2;
        pdVar11[sVar14] = dVar1 * pdVar12[sVar14] + dVar2 * pdVar8[sVar14];
        sVar14 = sVar14 + 1;
      } while (__new_size != sVar14);
    }
    pFVar4 = (this->fourier_transform_).fourier_transform_;
    iVar5 = (*pFVar4->_vptr_FourierTransformInterface[4])
                      (pFVar4,this_00,this_01,real_part_output,imag_part_output);
    if ((char)iVar5 != '\0') {
      std::vector<double,_std::allocator<double>_>::resize(real_part_output,(long)this->dct_length_)
      ;
      std::vector<double,_std::allocator<double>_>::resize(imag_part_output,(long)this->dct_length_)
      ;
      return true;
    }
  }
  return false;
}

Assistant:

bool InverseDiscreteCosineTransform::Run(
    const std::vector<double>& real_part_input,
    const std::vector<double>& imag_part_input,
    std::vector<double>* real_part_output,
    std::vector<double>* imag_part_output,
    InverseDiscreteCosineTransform::Buffer* buffer) const {
  // Check inputs.
  if (!fourier_transform_.IsValid() ||
      real_part_input.size() != static_cast<std::size_t>(dct_length_) ||
      imag_part_input.size() != static_cast<std::size_t>(dct_length_) ||
      NULL == real_part_output || NULL == imag_part_output || NULL == buffer) {
    return false;
  }

  // Prepare memories.
  const int dft_length(fourier_transform_.GetLength());
  if (buffer->fourier_transform_real_part_.size() !=
      static_cast<std::size_t>(dft_length)) {
    buffer->fourier_transform_real_part_.resize(dft_length);
  }
  if (buffer->fourier_transform_imag_part_.size() !=
      static_cast<std::size_t>(dft_length)) {
    buffer->fourier_transform_imag_part_.resize(dft_length);
  }

  // Prepare real part input.
  std::copy(real_part_input.begin(), real_part_input.end(),
            buffer->fourier_transform_real_part_.begin());
  std::transform(real_part_input.begin() + 1, real_part_input.end(),
                 buffer->fourier_transform_real_part_.begin() + dct_length_ + 1,
                 std::negate<double>());
  std::reverse(buffer->fourier_transform_real_part_.begin() + dct_length_ + 1,
               buffer->fourier_transform_real_part_.end());
  buffer->fourier_transform_real_part_[dct_length_] = 0.0;

  // Prepare imaginary part input.
  std::copy(imag_part_input.begin(), imag_part_input.end(),
            buffer->fourier_transform_imag_part_.begin());
  std::transform(imag_part_input.begin() + 1, imag_part_input.end(),
                 buffer->fourier_transform_imag_part_.begin() + dct_length_ + 1,
                 std::negate<double>());
  std::reverse(buffer->fourier_transform_imag_part_.begin() + dct_length_ + 1,
               buffer->fourier_transform_imag_part_.end());
  buffer->fourier_transform_imag_part_[dct_length_] = 0.0;

  const double* cosine_table(&(cosine_table_[0]));
  const double* sine_table(&(sine_table_[0]));
  double* fourier_transform_real_part(&buffer->fourier_transform_real_part_[0]);
  double* fourier_transform_imag_part(&buffer->fourier_transform_imag_part_[0]);

  for (int i(0); i < dft_length; ++i) {
    const double temp_real_part(fourier_transform_real_part[i]);
    const double temp_imag_part(fourier_transform_imag_part[i]);
    fourier_transform_real_part[i] =
        temp_real_part * cosine_table[i] - temp_imag_part * sine_table[i];
    fourier_transform_imag_part[i] =
        temp_real_part * sine_table[i] + temp_imag_part * cosine_table[i];
  }

  if (!fourier_transform_.Run(buffer->fourier_transform_real_part_,
                              buffer->fourier_transform_imag_part_,
                              real_part_output, imag_part_output)) {
    return false;
  }

  real_part_output->resize(dct_length_);
  imag_part_output->resize(dct_length_);

  return true;
}